

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall HighsMipSolverData::setupDomainPropagation(HighsMipSolverData *this)

{
  int iVar1;
  HighsLp *pHVar2;
  HighsMipSolver *mipsolver;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  HighsDomain HStack_358;
  
  pHVar2 = this->mipsolver->model_;
  highsSparseTranspose
            (pHVar2->num_row_,pHVar2->num_col_,&(pHVar2->a_matrix_).start_,
             &(pHVar2->a_matrix_).index_,&(pHVar2->a_matrix_).value_,&this->ARstart_,&this->ARindex_
             ,&this->ARvalue_);
  HighsPseudocost::HighsPseudocost((HighsPseudocost *)&HStack_358,this->mipsolver);
  HighsPseudocost::operator=(&this->pseudocost,(HighsPseudocost *)&HStack_358);
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)&HStack_358);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->maxAbsRowCoef,(long)this->mipsolver->model_->num_row_);
  mipsolver = this->mipsolver;
  uVar6 = (ulong)(uint)mipsolver->model_->num_row_;
  if (uVar6 != 0) {
    piVar3 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->maxAbsRowCoef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    iVar8 = *piVar3;
    do {
      iVar1 = piVar3[uVar7 + 1];
      dVar10 = 0.0;
      if (iVar1 != iVar8) {
        lVar9 = 0;
        dVar11 = 0.0;
        do {
          dVar10 = ABS(pdVar4[iVar8 + lVar9]);
          if (dVar10 <= dVar11) {
            dVar10 = dVar11;
          }
          lVar9 = lVar9 + 1;
          dVar11 = dVar10;
        } while (iVar1 - iVar8 != (int)lVar9);
      }
      pdVar5[uVar7] = dVar10;
      uVar7 = uVar7 + 1;
      iVar8 = iVar1;
    } while (uVar7 != uVar6);
  }
  HighsDomain::HighsDomain(&HStack_358,mipsolver);
  HighsDomain::operator=(&this->domain,&HStack_358);
  HighsDomain::~HighsDomain(&HStack_358);
  HighsDomain::computeRowActivities(&this->domain);
  return;
}

Assistant:

void HighsMipSolverData::setupDomainPropagation() {
  const HighsLp& model = *mipsolver.model_;
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart_,
                       ARindex_, ARvalue_);

  pseudocost = HighsPseudocost(mipsolver);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    for (HighsInt j = start; j != end; ++j)
      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));

    maxAbsRowCoef[i] = maxabsval;
  }

  domain = HighsDomain(mipsolver);
  domain.computeRowActivities();
}